

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_data_collection.cpp
# Opt level: O1

void __thiscall duckdb::RowDataCollection::Merge(RowDataCollection *this,RowDataCollection *other)

{
  BufferManager *buffer_manager;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true> *block;
  pointer __args;
  pointer __args_00;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *__range1;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  RowDataCollection local_b0;
  
  if (other->count != 0) {
    buffer_manager = this->buffer_manager;
    iVar5 = (*buffer_manager->_vptr_BufferManager[0xf])(buffer_manager);
    RowDataCollection(&local_b0,buffer_manager,CONCAT44(extraout_var,iVar5),1,false);
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)&other->rdc_lock);
    if (iVar5 != 0) {
      ::std::__throw_system_error(iVar5);
    }
    local_b0.count = other->count;
    local_b0.block_capacity = other->block_capacity;
    local_b0.entry_size = other->entry_size;
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ::_M_move_assign(&local_b0.blocks.
                      super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     ,&other->blocks);
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::_M_move_assign
              (&local_b0.pinned_blocks.
                super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>,
               &other->pinned_blocks);
    pthread_mutex_unlock((pthread_mutex_t *)&other->rdc_lock);
    Clear(other);
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->rdc_lock);
    if (iVar5 != 0) {
      ::std::__throw_system_error(iVar5);
    }
    this->count = this->count + local_b0.count;
    uVar1 = (uint)this->block_capacity;
    uVar2 = *(uint *)((long)&this->block_capacity + 4);
    uVar3 = (uint)this->entry_size;
    uVar4 = *(uint *)((long)&this->entry_size + 4);
    uVar6 = uVar2 ^ 0x80000000;
    uVar7 = uVar4 ^ 0x80000000;
    uVar9 = -(uint)((int)((uint)local_b0.block_capacity ^ 0x80000000) < (int)(uVar1 ^ 0x80000000));
    uVar10 = -(uint)((int)(local_b0.block_capacity._4_4_ ^ 0x80000000) < (int)uVar6);
    uVar11 = -(uint)((int)((uint)local_b0.entry_size ^ 0x80000000) < (int)(uVar3 ^ 0x80000000));
    uVar12 = -(uint)((int)(local_b0.entry_size._4_4_ ^ 0x80000000) < (int)uVar7);
    uVar6 = -(uint)((local_b0.block_capacity._4_4_ ^ 0x80000000) == uVar6);
    uVar7 = -(uint)((local_b0.entry_size._4_4_ ^ 0x80000000) == uVar7);
    uVar8 = uVar10 | uVar6 & uVar9;
    uVar10 = uVar10 | uVar6 & uVar9;
    uVar6 = uVar12 | uVar7 & uVar11;
    uVar12 = uVar12 | uVar7 & uVar11;
    *(uint *)&this->block_capacity = ~uVar8 & (uint)local_b0.block_capacity | uVar1 & uVar8;
    *(uint *)((long)&this->block_capacity + 4) =
         ~uVar10 & local_b0.block_capacity._4_4_ | uVar2 & uVar10;
    *(uint *)&this->entry_size = ~uVar6 & (uint)local_b0.entry_size | uVar3 & uVar6;
    *(uint *)((long)&this->entry_size + 4) = ~uVar12 & local_b0.entry_size._4_4_ | uVar4 & uVar12;
    if (local_b0.blocks.
        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_b0.blocks.
        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __args = local_b0.blocks.
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        ::std::
        vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
                    *)&this->blocks,__args);
        __args = __args + 1;
      } while (__args != local_b0.blocks.
                         super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_b0.pinned_blocks.
        super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
        super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_b0.pinned_blocks.
        super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
        super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __args_00 = local_b0.pinned_blocks.
                  super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
                  super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      do {
        ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::
        emplace_back<duckdb::BufferHandle>
                  (&(this->pinned_blocks).
                    super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>,
                   __args_00);
        __args_00 = __args_00 + 1;
      } while (__args_00 !=
               local_b0.pinned_blocks.
               super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
               super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->rdc_lock);
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
              (&local_b0.pinned_blocks.
                super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>);
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ::~vector(&local_b0.blocks.
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             );
  }
  return;
}

Assistant:

void RowDataCollection::Merge(RowDataCollection &other) {
	if (other.count == 0) {
		return;
	}
	RowDataCollection temp(buffer_manager, buffer_manager.GetBlockSize(), 1);
	{
		//	One lock at a time to avoid deadlocks
		lock_guard<mutex> read_lock(other.rdc_lock);
		temp.count = other.count;
		temp.block_capacity = other.block_capacity;
		temp.entry_size = other.entry_size;
		temp.blocks = std::move(other.blocks);
		temp.pinned_blocks = std::move(other.pinned_blocks);
	}
	other.Clear();

	lock_guard<mutex> write_lock(rdc_lock);
	count += temp.count;
	block_capacity = MaxValue(block_capacity, temp.block_capacity);
	entry_size = MaxValue(entry_size, temp.entry_size);
	for (auto &block : temp.blocks) {
		blocks.emplace_back(std::move(block));
	}
	for (auto &handle : temp.pinned_blocks) {
		pinned_blocks.emplace_back(std::move(handle));
	}
}